

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O1

bool InliningDecider::GetBuiltInInfo
               (FunctionInfo *funcInfo,OpCode *inlineCandidateOpCode,ValueType *returnType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (funcInfo == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x185,"(funcInfo)","funcInfo");
    if (!bVar2) goto LAB_00565bfd;
    *puVar3 = 0;
  }
  if (inlineCandidateOpCode == (OpCode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x186,"(inlineCandidateOpCode)","inlineCandidateOpCode");
    if (!bVar2) goto LAB_00565bfd;
    *puVar3 = 0;
  }
  if (returnType == (ValueType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x187,"(returnType)","returnType");
    if (!bVar2) {
LAB_00565bfd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *inlineCandidateOpCode = EndOfBlock;
  (returnType->field_0).field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)(ValueType)0x9;
  if ((funcInfo->functionBodyImpl).ptr != (FunctionProxy *)0x0) {
    return false;
  }
  bVar2 = GetBuiltInInfoCommon(funcInfo->functionId,inlineCandidateOpCode,returnType);
  return bVar2;
}

Assistant:

bool InliningDecider::GetBuiltInInfo(
    Js::FunctionInfo *const funcInfo,
    Js::OpCode *const inlineCandidateOpCode,
    ValueType *const returnType
)
{
    Assert(funcInfo);
    Assert(inlineCandidateOpCode);
    Assert(returnType);

    *inlineCandidateOpCode = (Js::OpCode)0;
    *returnType = ValueType::Uninitialized;

    if (funcInfo->HasBody())
    {
        return false;
    }
    return InliningDecider::GetBuiltInInfoCommon(
        funcInfo->GetLocalFunctionId(),
        inlineCandidateOpCode,
        returnType);
}